

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O0

bool llvm::DWARFDebugLoclists::dumpLocationList
               (DWARFDataExtractor *Data,uint64_t *Offset,uint16_t Version,raw_ostream *OS,
               uint64_t BaseAddr,MCRegisterInfo *MRI,DWARFUnit *U,DIDumpOptions DumpOpts,uint Indent
               )

{
  uint64_t this;
  ushort uVar1;
  uint64_t *Offset_00;
  bool bVar2;
  unsigned_long *puVar3;
  raw_ostream *this_00;
  Error *E_00;
  function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)> F;
  Error local_1c8;
  string local_1c0;
  anon_class_64_8_67d47438 local_190;
  intptr_t local_150 [2];
  undefined1 local_140 [8];
  Error E;
  StringRef local_120;
  size_t local_110;
  StringRef local_108;
  size_t local_f8;
  StringRef local_f0;
  size_t local_e0;
  StringRef local_d8;
  size_t local_c8;
  StringRef local_c0;
  size_t local_b0;
  StringRef local_a8;
  size_t local_98;
  StringRef local_90;
  size_t local_80;
  StringRef local_78;
  size_t local_68;
  StringRef local_60;
  size_t local_50;
  unsigned_long local_48;
  size_t MaxEncodingStringLength;
  MCRegisterInfo *MRI_local;
  uint64_t BaseAddr_local;
  raw_ostream *OS_local;
  uint64_t *puStack_20;
  uint16_t Version_local;
  uint64_t *Offset_local;
  DWARFDataExtractor *Data_local;
  
  local_48 = 0;
  MaxEncodingStringLength = (size_t)MRI;
  MRI_local = (MCRegisterInfo *)BaseAddr;
  BaseAddr_local = (uint64_t)OS;
  OS_local._6_2_ = Version;
  puStack_20 = Offset;
  Offset_local = (uint64_t *)Data;
  if (((undefined1  [24])DumpOpts & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    local_60 = dwarf::LocListEncodingString(0);
    local_50 = StringRef::size(&local_60);
    puVar3 = std::max<unsigned_long>(&local_48,&local_50);
    local_48 = *puVar3;
    local_78 = dwarf::LocListEncodingString(1);
    local_68 = StringRef::size(&local_78);
    puVar3 = std::max<unsigned_long>(&local_48,&local_68);
    local_48 = *puVar3;
    local_90 = dwarf::LocListEncodingString(2);
    local_80 = StringRef::size(&local_90);
    puVar3 = std::max<unsigned_long>(&local_48,&local_80);
    local_48 = *puVar3;
    local_a8 = dwarf::LocListEncodingString(3);
    local_98 = StringRef::size(&local_a8);
    puVar3 = std::max<unsigned_long>(&local_48,&local_98);
    local_48 = *puVar3;
    local_c0 = dwarf::LocListEncodingString(4);
    local_b0 = StringRef::size(&local_c0);
    puVar3 = std::max<unsigned_long>(&local_48,&local_b0);
    local_48 = *puVar3;
    local_d8 = dwarf::LocListEncodingString(5);
    local_c8 = StringRef::size(&local_d8);
    puVar3 = std::max<unsigned_long>(&local_48,&local_c8);
    local_48 = *puVar3;
    local_f0 = dwarf::LocListEncodingString(6);
    local_e0 = StringRef::size(&local_f0);
    puVar3 = std::max<unsigned_long>(&local_48,&local_e0);
    local_48 = *puVar3;
    local_108 = dwarf::LocListEncodingString(7);
    local_f8 = StringRef::size(&local_108);
    puVar3 = std::max<unsigned_long>(&local_48,&local_f8);
    local_48 = *puVar3;
    local_120 = dwarf::LocListEncodingString(8);
    local_110 = StringRef::size(&local_120);
    puVar3 = std::max<unsigned_long>(&local_48,&local_110);
    local_48 = *puVar3;
  }
  this = BaseAddr_local;
  format<unsigned_long>((format_object<unsigned_long> *)&E,"0x%8.8lx: ",puStack_20);
  raw_ostream::operator<<((raw_ostream *)this,(format_object_base *)&E);
  Offset_00 = Offset_local;
  puVar3 = puStack_20;
  uVar1 = OS_local._6_2_;
  local_190.OS = (raw_ostream *)BaseAddr_local;
  local_190.BaseAddr = (uint64_t *)&MRI_local;
  local_190.Data = (DWARFDataExtractor *)Offset_local;
  local_190.MRI = (MCRegisterInfo **)&MaxEncodingStringLength;
  local_190.U = &U;
  local_190.Indent = &Indent;
  local_190.MaxEncodingStringLength = &local_48;
  local_190.DumpOpts = &DumpOpts;
  function_ref<bool(llvm::DWARFDebugLoclists::Entry_const&)>::
  function_ref<llvm::DWARFDebugLoclists::dumpLocationList(llvm::DWARFDataExtractor_const&,unsigned_long*,unsigned_short,llvm::raw_ostream&,unsigned_long,llvm::MCRegisterInfo_const*,llvm::DWARFUnit*,llvm::DIDumpOptions,unsigned_int)::__0>
            ((function_ref<bool(llvm::DWARFDebugLoclists::Entry_const&)> *)local_150,&local_190,
             (type *)0x0);
  F.callback = (_func_bool_intptr_t_Entry_ptr *)(ulong)uVar1;
  F.callable = local_150[0];
  visitLocationList((DWARFDataExtractor *)local_140,Offset_00,(uint16_t)puVar3,F);
  bVar2 = Error::operator_cast_to_bool((Error *)local_140);
  if (bVar2) {
    raw_ostream::operator<<((raw_ostream *)BaseAddr_local,"\n");
    raw_ostream::indent((raw_ostream *)BaseAddr_local,Indent);
    this_00 = raw_ostream::operator<<((raw_ostream *)BaseAddr_local,"error: ");
    Error::Error(&local_1c8,(Error *)local_140);
    toString_abi_cxx11_(&local_1c0,(llvm *)&local_1c8,E_00);
    raw_ostream::operator<<(this_00,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    Error::~Error(&local_1c8);
  }
  Data_local._7_1_ = !bVar2;
  Error::~Error((Error *)local_140);
  return (bool)(Data_local._7_1_ & 1);
}

Assistant:

bool DWARFDebugLoclists::dumpLocationList(const DWARFDataExtractor &Data,
                                          uint64_t *Offset, uint16_t Version,
                                          raw_ostream &OS, uint64_t BaseAddr,
                                          const MCRegisterInfo *MRI,
                                          DWARFUnit *U, DIDumpOptions DumpOpts,
                                          unsigned Indent) {
  size_t MaxEncodingStringLength = 0;
  if (DumpOpts.Verbose) {
#define HANDLE_DW_LLE(ID, NAME)                                                \
  MaxEncodingStringLength = std::max(MaxEncodingStringLength,                  \
                                     dwarf::LocListEncodingString(ID).size());
#include "llvm/BinaryFormat/Dwarf.def"
  }

  OS << format("0x%8.8" PRIx64 ": ", *Offset);
  Error E = visitLocationList(Data, Offset, Version, [&](const Entry &E) {
    E.dump(OS, BaseAddr, Data.isLittleEndian(), Data.getAddressSize(), MRI, U,
           DumpOpts, Indent, MaxEncodingStringLength);
    return true;
  });
  if (E) {
    OS << "\n";
    OS.indent(Indent);
    OS << "error: " << toString(std::move(E));
    return false;
  }
  return true;
}